

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DuplicateColsPS::DuplicateColsPS
          (DuplicateColsPS *this,DuplicateColsPS *old)

{
  DataArray<int> *in_RSI;
  PostStep *in_RDI;
  PostStep *in_stack_ffffffffffffffe0;
  DataArray<int> *in_stack_ffffffffffffffe8;
  
  PostStep::PostStep(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_PostStep = (_func_int **)&PTR__DuplicateColsPS_004ed378;
  *(undefined4 *)&in_RDI[1]._vptr_PostStep = *(undefined4 *)&in_RSI[1].memFactor;
  *(undefined4 *)((long)&in_RDI[1]._vptr_PostStep + 4) =
       *(undefined4 *)((long)&in_RSI[1].memFactor + 4);
  in_RDI[1].m_name = *(char **)(in_RSI + 2);
  *(int **)&in_RDI[1].nCols = in_RSI[2].data;
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RSI[2].memFactor;
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 3);
  in_RDI[2]._vptr_PostStep = (_func_int **)in_RSI[3].data;
  *(byte *)&in_RDI[2].m_name = *(byte *)&in_RSI[3].memFactor & 1;
  *(byte *)((long)&in_RDI[2].m_name + 1) = *(byte *)((long)&in_RSI[3].memFactor + 1) & 1;
  DataArray<int>::DataArray(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

DuplicateColsPS(const DuplicateColsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_loJ(old.m_loJ)
         , m_upJ(old.m_upJ)
         , m_loK(old.m_loK)
         , m_upK(old.m_upK)
         , m_scale(old.m_scale)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_perm(old.m_perm)
      {}